

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O1

void FT_Done_Glyph(FT_Glyph glyph)

{
  FT_Memory memory;
  FT_Glyph_DoneFunc p_Var1;
  
  if (glyph != (FT_Glyph)0x0) {
    memory = glyph->library->memory;
    p_Var1 = glyph->clazz->glyph_done;
    if (p_Var1 != (FT_Glyph_DoneFunc)0x0) {
      (*p_Var1)(glyph);
    }
    ft_mem_free(memory,glyph);
    return;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Done_Glyph( FT_Glyph  glyph )
  {
    if ( glyph )
    {
      FT_Memory              memory = glyph->library->memory;
      const FT_Glyph_Class*  clazz  = glyph->clazz;


      if ( clazz->glyph_done )
        clazz->glyph_done( glyph );

      FT_FREE( glyph );
    }
  }